

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

apx_error_t apx_file_write_notify(apx_file_t *self,uint32_t offset,uint8_t *src,uint32_t len)

{
  apx_file_write_notify_func *UNRECOVERED_JUMPTABLE;
  apx_error_t aVar1;
  
  if (self == (apx_file_t *)0x0) {
    aVar1 = 1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    if (self->has_first_write == false) {
      self->has_first_write = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
    UNRECOVERED_JUMPTABLE = (self->notification_handler).write_notify;
    if (UNRECOVERED_JUMPTABLE != (apx_file_write_notify_func *)0x0) {
      aVar1 = (*UNRECOVERED_JUMPTABLE)((self->notification_handler).arg,self,offset,src,len);
      return aVar1;
    }
    aVar1 = 0x34;
  }
  return aVar1;
}

Assistant:

apx_error_t apx_file_write_notify(apx_file_t* self, uint32_t offset, const uint8_t* src, uint32_t len)
{
   if (self != 0)
   {
      apx_file_lock(self);
      if (!self->has_first_write)
      {
         self->has_first_write = true;
      }
      apx_file_unlock(self);
      if (self->notification_handler.write_notify != 0)
      {
         return self->notification_handler.write_notify(self->notification_handler.arg, self, offset, src, len);
      }
      return APX_INVALID_WRITE_HANDLER_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}